

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O3

void writeModelObjective(FILE *file,HighsLogOptions *log_options,HighsModel *model,
                        vector<double,_std::allocator<double>_> *primal_solution)

{
  double dVar1;
  double dVar2;
  HighsCDouble HVar3;
  HighsCDouble HVar4;
  double local_30;
  double local_28;
  
  HVar3 = HighsLp::objectiveCDoubleValue(&model->lp_,primal_solution);
  HVar4 = HighsHessian::objectiveCDoubleValue(&model->hessian_,primal_solution);
  dVar1 = HVar4.hi;
  local_30 = HVar3.hi;
  dVar2 = local_30 + dVar1;
  local_28 = HVar3.lo;
  writeObjectiveValue(file,log_options,
                      (dVar1 - (dVar2 - (dVar2 - dVar1))) + (local_30 - (dVar2 - dVar1)) + local_28
                      + HVar4.lo + dVar2);
  return;
}

Assistant:

void writeModelObjective(FILE* file, const HighsLogOptions& log_options,
                         const HighsModel& model,
                         const std::vector<double>& primal_solution) {
  HighsCDouble objective_value =
      model.lp_.objectiveCDoubleValue(primal_solution);
  objective_value += model.hessian_.objectiveCDoubleValue(primal_solution);
  writeObjectiveValue(file, log_options, (double)objective_value);
}